

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_stalker.cpp
# Opt level: O2

int AF_A_StalkerAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  int damage;
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  uint uVar3;
  int iVar4;
  AActor *pAVar5;
  FState *newstate;
  AActor *this_00;
  char *__assertion;
  DAngle angle;
  FName local_28;
  FName local_24;
  undefined8 local_20;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0054e4f5;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_0054e38b:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0054e4f5;
        }
      }
      if (numparam == 1) goto LAB_0054e40b;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0054e4e5;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0054e4f5;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0054e4e5;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0054e40b:
        if (((this_00->flags).Value & 0x200) == 0) {
          obj = &this_00->target;
          pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
          if (pAVar5 != (AActor *)0x0) {
            A_FaceTarget(this_00);
            bVar2 = AActor::CheckMeleeRange(this_00);
            if (bVar2) {
              uVar3 = FRandom::operator()(&pr_stalker);
              damage = (uVar3 & 7) * 2 + 2;
              pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
              local_28.Index = 0x84;
              local_20 = 0;
              iVar4 = P_DamageMobj(pAVar5,this_00,this_00,damage,&local_28,0,angle);
              if (0 < iVar4) {
                damage = iVar4;
              }
              pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
              P_TraceBleed(damage,pAVar5,this_00);
            }
          }
        }
        else {
          FName::FName(&local_24,"Drop");
          newstate = AActor::FindState(this_00,&local_24);
          AActor::SetState(this_00,newstate,false);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0054e4f5;
    }
    if (this_00 == (AActor *)0x0) goto LAB_0054e38b;
  }
LAB_0054e4e5:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0054e4f5:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_stalker.cpp"
                ,0x3c,"int AF_A_StalkerAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_StalkerAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (self->flags & MF_NOGRAVITY)
	{
		self->SetState (self->FindState("Drop"));
	}
	else if (self->target != NULL)
	{
		A_FaceTarget (self);
		if (self->CheckMeleeRange ())
		{
			int damage = (pr_stalker() & 7) * 2 + 2;

			int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
			P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
		}
	}
	return 0;
}